

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Histogram
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *histogram)

{
  uint32_t uVar1;
  uchar *puVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  reference pvVar6;
  uint in_ECX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R9;
  uint8_t *imageXEnd;
  uint8_t *imageX;
  uint8_t *imageYEnd;
  uint8_t *imageY;
  uint32_t rowSize;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa8;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffc0;
  byte *pbVar7;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffd0;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
             (uint32_t)((ulong)in_stack_ffffffffffffffc0._M_current >> 0x20),
             (uint32_t)in_stack_ffffffffffffffc0._M_current);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)in_stack_ffffffffffffffc0._M_current);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8._M_current,
             in_stack_ffffffffffffffb0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffd0,
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffffa8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffffa8);
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(uint *)in_stack_ffffffffffffffb0);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  puVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  pbVar3 = puVar2 + (ulong)in_ESI + (ulong)(in_EDX * uVar1);
  pbVar4 = pbVar3 + in_R8D * uVar1;
  while (pbVar3 != pbVar4) {
    pbVar5 = pbVar3 + in_ECX;
    pbVar7 = pbVar3;
    for (; pbVar3 != pbVar5; pbVar3 = pbVar3 + 1) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_R9,(ulong)*pbVar3);
      *pvVar6 = *pvVar6 + 1;
    }
    pbVar3 = pbVar7 + uVar1;
  }
  return;
}

Assistant:

void Histogram( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, std::vector < uint32_t > & histogram )
    {
        ParameterValidation( image, x, y, width, height );
        VerifyGrayScaleImage( image );
        OptimiseRoi( width, height, image );

        histogram.resize( 256u );
        std::fill( histogram.begin(), histogram.end(), 0u );

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY = image.data() + y * rowSize + x;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + width;

            for( ; imageX != imageXEnd; ++imageX )
                ++histogram[*imageX];
        }
    }